

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_parameters.cpp
# Opt level: O0

int __thiscall
cpp_db::sqlite_parameters::bind(sqlite_parameters *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar3;
  size_t sVar4;
  size_type sVar5;
  char *pcVar6;
  size_type sVar7;
  void *pvVar8;
  uchar *__src;
  long lVar9;
  undefined7 extraout_var;
  sqlite3_stmt *psVar10;
  parameter *arg;
  parameter *arg_00;
  undefined4 in_register_00000034;
  int local_11c;
  type_index local_110;
  type_index local_108;
  void *local_100;
  uint8_t *value_2;
  blob source_2;
  type_index local_d8;
  void *local_d0;
  char *value_1;
  string source_1;
  type_index local_a0;
  void *local_98;
  char *value;
  char *source;
  type_index local_80;
  type_index local_78;
  type_index local_70;
  type_index local_68;
  type_index local_60 [3];
  byte local_41;
  string local_40;
  int local_1c;
  parameter *ppStack_18;
  int index;
  parameter *param_local;
  sqlite_parameters *this_local;
  
  ppStack_18 = (parameter *)CONCAT44(in_register_00000034,__fd);
  param_local = (parameter *)this;
  bVar1 = parameter::has_index(ppStack_18);
  local_41 = 0;
  if (bVar1) {
    local_11c = parameter::get_index(ppStack_18);
  }
  else {
    parameter::get_name_abi_cxx11_(&local_40,ppStack_18);
    local_41 = 1;
    local_11c = find_param_pos(this,&local_40);
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  local_1c = local_11c;
  local_60[0] = type_of(ppStack_18);
  std::type_index::type_index(&local_68,(type_info *)&int::typeinfo);
  bVar1 = std::type_index::operator==(local_60,&local_68);
  if (bVar1) {
    psVar10 = get_stmt_handle(this);
    iVar3 = local_1c;
    iVar2 = value_of<int>(ppStack_18);
    iVar3 = sqlite3_bind_int(psVar10,iVar3,iVar2);
  }
  else {
    local_70 = type_of(ppStack_18);
    std::type_index::type_index(&local_78,(type_info *)&double::typeinfo);
    bVar1 = std::type_index::operator==(&local_70,&local_78);
    if (bVar1) {
      psVar10 = get_stmt_handle(this);
      iVar3 = local_1c;
      value_of<double>(ppStack_18);
      iVar3 = sqlite3_bind_double(psVar10,iVar3);
    }
    else {
      local_80 = type_of(ppStack_18);
      std::type_index::type_index((type_index *)&source,(type_info *)&char_const*::typeinfo);
      bVar1 = std::type_index::operator==(&local_80,(type_index *)&source);
      if (bVar1) {
        value = value_of<char_const*>(ppStack_18);
        sVar4 = strlen(value);
        pvVar8 = operator_new__(sVar4 + 1);
        pcVar6 = value;
        local_98 = pvVar8;
        sVar4 = strlen(value);
        memcpy(pvVar8,pcVar6,sVar4 + 1);
        psVar10 = get_stmt_handle(this);
        iVar3 = local_1c;
        pvVar8 = local_98;
        sVar4 = strlen(value);
        iVar3 = sqlite3_bind_text(psVar10,iVar3,pvVar8,sVar4 & 0xffffffff,delete_array<char>);
      }
      else {
        local_a0 = type_of(ppStack_18);
        std::type_index::type_index
                  ((type_index *)((long)&source_1.field_2 + 8),
                   (type_info *)&std::__cxx11::string::typeinfo);
        bVar1 = std::type_index::operator==(&local_a0,(type_index *)((long)&source_1.field_2 + 8));
        if (bVar1) {
          value_of<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                     (cpp_db *)ppStack_18,arg);
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
          pvVar8 = operator_new__(sVar5 + 1);
          local_d0 = pvVar8;
          pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
          memcpy(pvVar8,pcVar6,sVar5 + 1);
          psVar10 = get_stmt_handle(this);
          iVar3 = local_1c;
          pvVar8 = local_d0;
          sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
          sqlite3_bind_text(psVar10,iVar3,pvVar8,sVar5 & 0xffffffff,delete_array<char>);
          std::__cxx11::string::~string((string *)&value_1);
          iVar3 = extraout_EAX;
        }
        else {
          local_d8 = type_of(ppStack_18);
          std::type_index::type_index
                    ((type_index *)
                     &source_2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (type_info *)
                     &std::vector<unsigned_char,std::allocator<unsigned_char>>::typeinfo);
          bVar1 = std::type_index::operator==
                            (&local_d8,
                             (type_index *)
                             &source_2.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar1) {
            value_of<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value_2,
                       (cpp_db *)ppStack_18,arg_00);
            sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value_2);
            pvVar8 = operator_new__(sVar7);
            local_100 = pvVar8;
            __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value_2);
            sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value_2);
            memcpy(pvVar8,__src,sVar7);
            psVar10 = get_stmt_handle(this);
            iVar3 = local_1c;
            pvVar8 = local_100;
            sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value_2);
            sqlite3_bind_blob(psVar10,iVar3,pvVar8,sVar7 & 0xffffffff,delete_array<unsigned_char>);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value_2);
            iVar3 = extraout_EAX_00;
          }
          else {
            local_108 = type_of(ppStack_18);
            std::type_index::type_index(&local_110,(type_info *)&long::typeinfo);
            bVar1 = std::type_index::operator==(&local_108,&local_110);
            if (bVar1) {
              psVar10 = get_stmt_handle(this);
              iVar3 = local_1c;
              lVar9 = value_of<long>(ppStack_18);
              iVar3 = sqlite3_bind_int64(psVar10,iVar3,lVar9);
            }
            else {
              bVar1 = is_null(ppStack_18);
              iVar3 = (int)CONCAT71(extraout_var,bVar1);
              if (bVar1) {
                psVar10 = get_stmt_handle(this);
                iVar3 = sqlite3_bind_null(psVar10,local_1c);
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

void sqlite_parameters::bind(const parameter &param)
{
    int index = param.has_index() ? param.get_index() : find_param_pos(param.get_name());
    if (type_of(param) == typeid(int))
        sqlite3_bind_int(get_stmt_handle(), index, value_of<int>(param));
    else if (type_of(param) == typeid(double))
        sqlite3_bind_double(get_stmt_handle(), index, value_of<double>(param));
    else if (type_of(param) == typeid(const char *))
    {
        const char *source = value_of<const char *>(param);
        char * value = new char[strlen(source) + 1];
        memcpy(value, source, strlen(source) + 1);
		sqlite3_bind_text(get_stmt_handle(), index, value, static_cast<int>(strlen(source)), delete_array<char>);
    }
    else if (type_of(param) == typeid(std::string))
    {
        std::string source(value_of<std::string>(param));
        char * value = new char[source.length() + 1];
        memcpy(value, source.c_str(), source.length() + 1);
		sqlite3_bind_text(get_stmt_handle(), index, value, static_cast<int>(source.length()), delete_array<char>);
    }
    else if (type_of(param) == typeid(blob))
    {
        blob source(value_of<blob>(param));
        uint8_t *value = new uint8_t[source.size()];
        memcpy(value, source.data(), source.size());
		sqlite3_bind_blob(get_stmt_handle(), index, value, static_cast<int>(source.size()), delete_array<uint8_t>);
    }
    else if (type_of(param) == typeid(int64_t))
        sqlite3_bind_int64(get_stmt_handle(), index, value_of<int64_t>(param));
    else if (is_null(param))
		sqlite3_bind_null(get_stmt_handle(), index);
}